

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O2

void chacha_block(mi_random_ctx_t *ctx)

{
  uint32_t *puVar1;
  size_t i;
  long lVar2;
  ulong uVar3;
  uint32_t x [16];
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    x[lVar2] = ctx->input[lVar2];
  }
  for (uVar3 = 0; uVar3 < 0x14; uVar3 = uVar3 + 2) {
    qround(x,0,4,8,0xc);
    qround(x,1,5,9,0xd);
    qround(x,2,6,10,0xe);
    qround(x,3,7,0xb,0xf);
    qround(x,0,5,10,0xf);
    qround(x,1,6,0xb,0xc);
    qround(x,2,7,8,0xd);
    qround(x,3,4,9,0xe);
  }
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    ctx->output[lVar2] = ctx->input[lVar2] + x[lVar2];
  }
  ctx->output_available = 0x10;
  puVar1 = ctx->input + 0xc;
  *puVar1 = *puVar1 + 1;
  if (*puVar1 == 0) {
    puVar1 = ctx->input + 0xd;
    *puVar1 = *puVar1 + 1;
    if (*puVar1 == 0) {
      ctx->input[0xe] = ctx->input[0xe] + 1;
    }
  }
  return;
}

Assistant:

static void chacha_block(mi_random_ctx_t* ctx)
{
  // scramble into `x`
  uint32_t x[16];
  for (size_t i = 0; i < 16; i++) {
    x[i] = ctx->input[i];
  }
  for (size_t i = 0; i < MI_CHACHA_ROUNDS; i += 2) {
    qround(x, 0, 4,  8, 12);
    qround(x, 1, 5,  9, 13);
    qround(x, 2, 6, 10, 14);
    qround(x, 3, 7, 11, 15);
    qround(x, 0, 5, 10, 15);
    qround(x, 1, 6, 11, 12);
    qround(x, 2, 7,  8, 13);
    qround(x, 3, 4,  9, 14);
  }

  // add scrambled data to the initial state
  for (size_t i = 0; i < 16; i++) {
    ctx->output[i] = x[i] + ctx->input[i];
  }
  ctx->output_available = 16;

  // increment the counter for the next round
  ctx->input[12] += 1;
  if (ctx->input[12] == 0) {
    ctx->input[13] += 1;
    if (ctx->input[13] == 0) {  // and keep increasing into the nonce
      ctx->input[14] += 1;
    }
  }
}